

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QByteArray * __thiscall
QStringBuilder<const_char_(&)[8],_const_QByteArray_&>::convertTo<QByteArray>
          (QByteArray *__return_storage_ptr__,
          QStringBuilder<const_char_(&)[8],_const_QByteArray_&> *this)

{
  char cVar1;
  char *pcVar2;
  size_t __n;
  char *pcVar3;
  char *pcVar4;
  char *__dest;
  
  pcVar4 = (char *)((this->b->d).size + 7);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(__return_storage_ptr__,(longlong)pcVar4,Uninitialized);
  pcVar2 = (__return_storage_ptr__->d).ptr;
  pcVar3 = *this->a;
  cVar1 = *pcVar3;
  __dest = pcVar2;
  while (cVar1 != '\0') {
    pcVar3 = pcVar3 + 1;
    *__dest = cVar1;
    __dest = __dest + 1;
    cVar1 = *pcVar3;
  }
  __n = (this->b->d).size;
  if (__n != 0) {
    memcpy(__dest,(this->b->d).ptr,__n);
  }
  if (pcVar4 != __dest + (__n - (long)pcVar2)) {
    QByteArray::resize((longlong)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }